

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticClient.cpp
# Opt level: O0

void __thiscall
slang::DiagnosticClient::getIncludeStack
          (DiagnosticClient *this,BufferID buffer,SmallVectorBase<slang::SourceLocation> *stack)

{
  bool bVar1;
  uint32_t in_ESI;
  SourceLocation *in_RDI;
  SourceManager *in_stack_00000010;
  SourceLocation loc;
  undefined4 in_stack_ffffffffffffffd0;
  BufferID in_stack_ffffffffffffffd4;
  BufferID in_stack_ffffffffffffffd8;
  uint32_t local_4;
  
  SmallVectorBase<slang::SourceLocation>::clear
            ((SmallVectorBase<slang::SourceLocation> *)
             CONCAT44(in_stack_ffffffffffffffd4.id,in_stack_ffffffffffffffd0));
  local_4 = in_ESI;
  while( true ) {
    bVar1 = BufferID::operator_cast_to_bool((BufferID *)0xabb76f);
    if (!bVar1) {
      return;
    }
    SourceManager::getIncludedFrom(in_stack_00000010,(BufferID)loc._4_4_);
    in_stack_ffffffffffffffd8 =
         SourceLocation::buffer((SourceLocation *)CONCAT44(local_4,in_stack_ffffffffffffffd8.id));
    bVar1 = BufferID::operator_cast_to_bool((BufferID *)0xabb7ab);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    SmallVectorBase<slang::SourceLocation>::push_back
              ((SmallVectorBase<slang::SourceLocation> *)
               CONCAT44(in_stack_ffffffffffffffd4.id,in_stack_ffffffffffffffd0),in_RDI);
    in_stack_ffffffffffffffd4 =
         SourceLocation::buffer((SourceLocation *)CONCAT44(local_4,in_stack_ffffffffffffffd8.id));
    local_4 = in_stack_ffffffffffffffd4.id;
  }
  return;
}

Assistant:

void DiagnosticClient::getIncludeStack(BufferID buffer,
                                       SmallVectorBase<SourceLocation>& stack) const {
    stack.clear();
    while (buffer) {
        SourceLocation loc = sourceManager->getIncludedFrom(buffer);
        if (!loc.buffer())
            break;

        stack.push_back(loc);
        buffer = loc.buffer();
    }
}